

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Array<unsigned_char> * __thiscall
kj::ReadableFile::readAllBytes(Array<unsigned_char> *__return_storage_ptr__,ReadableFile *this)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  undefined4 extraout_var;
  uchar *puVar4;
  Array<unsigned_char> result;
  uchar *local_68;
  size_t local_60;
  ArrayDisposer *local_58;
  ulong capacity;
  
  (*(this->super_FsNode)._vptr_FsNode[2])(&local_68);
  puVar3 = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                              (1,local_60,local_60,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
  __return_storage_ptr__->ptr = puVar3;
  __return_storage_ptr__->size_ = local_60;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  iVar2 = (*(this->super_FsNode)._vptr_FsNode[6])(this,0,puVar3);
  capacity = CONCAT44(extraout_var,iVar2);
  if (capacity < __return_storage_ptr__->size_) {
    puVar3 = __return_storage_ptr__->ptr;
    local_68 = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                  (1,0,capacity,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
    puVar4 = local_68;
    if (capacity != 0) {
      puVar4 = local_68 + capacity;
      memcpy(local_68,puVar3,capacity);
    }
    local_60 = (long)puVar4 - (long)local_68;
    local_58 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    puVar3 = __return_storage_ptr__->ptr;
    if (puVar3 != (uchar *)0x0) {
      sVar1 = __return_storage_ptr__->size_;
      __return_storage_ptr__->ptr = (uchar *)0x0;
      __return_storage_ptr__->size_ = 0;
      (**__return_storage_ptr__->disposer->_vptr_ArrayDisposer)
                (__return_storage_ptr__->disposer,puVar3,1,sVar1,sVar1,0);
    }
    __return_storage_ptr__->ptr = local_68;
    __return_storage_ptr__->size_ = local_60;
    __return_storage_ptr__->disposer = local_58;
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> ReadableFile::readAllBytes() const {
  Array<byte> result = heapArray<byte>(stat().size);
  size_t n = read(0, result.asBytes());
  if (n < result.size()) {
    // Apparently file was truncated concurrently. Reduce to new size to match.
    result = heapArray(result.slice(0, n));
  }
  return result;
}